

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Expected<llvm::sys::fs::TempFile> *
llvm::sys::fs::TempFile::create
          (Expected<llvm::sys::fs::TempFile> *__return_storage_ptr__,Twine *Model,uint Mode)

{
  bool bVar1;
  string *ErrMsg;
  error_code eVar2;
  StringRef SVar3;
  error_code EC_00;
  Error local_150;
  undefined1 local_148 [8];
  error_code EC_1;
  sys *local_130;
  ulong local_128;
  undefined1 local_110 [8];
  TempFile Ret;
  Error local_c8;
  undefined1 local_c0 [8];
  error_code EC;
  SmallString<128U> ResultPath;
  int FD;
  uint Mode_local;
  Twine *Model_local;
  
  ResultPath.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._124_4_ =
       Mode;
  SmallString<128U>::SmallString((SmallString<128U> *)&EC._M_cat);
  eVar2 = createUniqueFile(Model,(int *)(ResultPath.super_SmallVector<char,_128U>.
                                         super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),
                           (SmallVectorImpl<char> *)&EC._M_cat,
                           ResultPath.super_SmallVector<char,_128U>.
                           super_SmallVectorStorage<char,_128U>.InlineElts._124_4_,OF_Delete);
  EC._0_8_ = eVar2._M_cat;
  local_c0._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_c0);
  if (bVar1) {
    eVar2._M_cat._0_4_ = local_c0._0_4_;
    eVar2._0_8_ = &local_c8;
    eVar2._M_cat._4_4_ = 0;
    errorCodeToError(eVar2);
    Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,&local_c8);
    Error::~Error(&local_c8);
    Ret._44_4_ = 1;
  }
  else {
    SVar3 = SmallString::operator_cast_to_StringRef((SmallString *)&EC._M_cat);
    ErrMsg = (string *)
             (ulong)(uint)ResultPath.super_SmallVector<char,_128U>.
                          super_SmallVectorStorage<char,_128U>.InlineElts._120_4_;
    TempFile((TempFile *)local_110,SVar3,
             ResultPath.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
             InlineElts._120_4_);
    SVar3 = SmallString::operator_cast_to_StringRef((SmallString *)&EC._M_cat);
    local_130 = (sys *)SVar3.Data;
    local_128 = SVar3.Length;
    SVar3.Length = 0;
    SVar3.Data = (char *)local_128;
    bVar1 = RemoveFileOnSignal(local_130,SVar3,ErrMsg);
    if (bVar1) {
      discard((TempFile *)&EC_1._M_cat);
      consumeError((Error *)&EC_1._M_cat);
      Error::~Error((Error *)&EC_1._M_cat);
      std::error_code::error_code<llvm::errc,void>((error_code *)local_148,operation_not_permitted);
      EC_00._M_cat._0_4_ = local_148._0_4_;
      EC_00._0_8_ = &local_150;
      EC_00._M_cat._4_4_ = 0;
      errorCodeToError(EC_00);
      Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,&local_150);
      Error::~Error(&local_150);
    }
    else {
      Expected<llvm::sys::fs::TempFile>::Expected<llvm::sys::fs::TempFile>
                (__return_storage_ptr__,(TempFile *)local_110,(type *)0x0);
    }
    Ret._44_4_ = 1;
    ~TempFile((TempFile *)local_110);
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)&EC._M_cat);
  return __return_storage_ptr__;
}

Assistant:

Expected<TempFile> TempFile::create(const Twine &Model, unsigned Mode) {
  int FD;
  SmallString<128> ResultPath;
  if (std::error_code EC =
          createUniqueFile(Model, FD, ResultPath, Mode, OF_Delete))
    return errorCodeToError(EC);

  TempFile Ret(ResultPath, FD);
#ifndef _WIN32
  if (sys::RemoveFileOnSignal(ResultPath)) {
    // Make sure we delete the file when RemoveFileOnSignal fails.
    consumeError(Ret.discard());
    std::error_code EC(errc::operation_not_permitted);
    return errorCodeToError(EC);
  }
#endif
  return std::move(Ret);
}